

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

int xmlVSetError(xmlError *err,void *ctxt,xmlNodePtr node,int domain,int code,xmlErrorLevel level,
                char *file,int line,char *str1,char *str2,char *str3,int int1,int col,char *fmt,
                __va_list_tag *ap)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  xmlChar *local_60;
  xmlChar *local_38;
  
  if (code == 0) {
    xmlResetError(err);
    return 0;
  }
  if (fmt == (char *)0x0) {
    pxVar2 = (xmlChar *)(*xmlMemStrdup)("No error message provided");
  }
  else {
    iVar1 = xmlStrVASPrintf(&local_38,64000,fmt,ap);
    local_60 = (xmlChar *)0x0;
    pxVar2 = (xmlChar *)0x0;
    if (-1 < iVar1) {
      pxVar2 = local_38;
    }
    pxVar4 = (xmlChar *)0x0;
    pxVar5 = (xmlChar *)0x0;
    if (-1 >= iVar1) goto LAB_0012d45f;
  }
  if (pxVar2 == (xmlChar *)0x0) {
    pxVar2 = (xmlChar *)0x0;
LAB_0012d451:
    local_60 = (xmlChar *)0x0;
LAB_0012d45a:
    pxVar4 = (xmlChar *)0x0;
LAB_0012d45c:
    pxVar5 = (xmlChar *)0x0;
LAB_0012d45f:
    (*xmlFree)(pxVar2);
    (*xmlFree)(local_60);
    (*xmlFree)(pxVar4);
    (*xmlFree)(pxVar5);
    (*xmlFree)((void *)0x0);
    return -1;
  }
  if (file == (char *)0x0) {
    local_60 = (xmlChar *)0x0;
  }
  else {
    local_60 = xmlStrdup((xmlChar *)file);
    if (local_60 == (xmlChar *)0x0) goto LAB_0012d451;
  }
  if (str1 == (char *)0x0) {
    pxVar4 = (xmlChar *)0x0;
  }
  else {
    pxVar4 = xmlStrdup((xmlChar *)str1);
    if (pxVar4 == (xmlChar *)0x0) goto LAB_0012d45a;
  }
  if (str2 == (char *)0x0) {
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    pxVar5 = xmlStrdup((xmlChar *)str2);
    if (pxVar5 == (xmlChar *)0x0) goto LAB_0012d45c;
  }
  if (str3 == (char *)0x0) {
    pxVar3 = (xmlChar *)0x0;
  }
  else {
    pxVar3 = xmlStrdup((xmlChar *)str3);
    if (pxVar3 == (xmlChar *)0x0) goto LAB_0012d45f;
  }
  xmlResetError(err);
  err->domain = domain;
  err->code = code;
  err->message = (char *)pxVar2;
  err->level = level;
  err->file = (char *)local_60;
  err->line = line;
  err->str1 = (char *)pxVar4;
  err->str2 = (char *)pxVar5;
  err->str3 = (char *)pxVar3;
  err->int1 = int1;
  err->int2 = col;
  err->node = node;
  err->ctxt = ctxt;
  return 0;
}

Assistant:

static int
xmlVSetError(xmlError *err,
             void *ctxt, xmlNodePtr node,
             int domain, int code, xmlErrorLevel level,
             const char *file, int line,
             const char *str1, const char *str2, const char *str3,
             int int1, int col,
             const char *fmt, va_list ap)
{
    char *message = NULL;
    char *fileCopy = NULL;
    char *str1Copy = NULL;
    char *str2Copy = NULL;
    char *str3Copy = NULL;

    if (code == XML_ERR_OK) {
        xmlResetError(err);
        return(0);
    }

    /*
     * Formatting the message
     */
    if (fmt == NULL) {
        message = xmlMemStrdup("No error message provided");
    } else {
        xmlChar *tmp;
        int res;

        res = xmlStrVASPrintf(&tmp, MAX_ERR_MSG_SIZE, fmt, ap);
        if (res < 0)
            goto err_memory;
        message = (char *) tmp;
    }
    if (message == NULL)
        goto err_memory;

    if (file != NULL) {
        fileCopy = (char *) xmlStrdup((const xmlChar *) file);
        if (fileCopy == NULL)
            goto err_memory;
    }
    if (str1 != NULL) {
        str1Copy = (char *) xmlStrdup((const xmlChar *) str1);
        if (str1Copy == NULL)
            goto err_memory;
    }
    if (str2 != NULL) {
        str2Copy = (char *) xmlStrdup((const xmlChar *) str2);
        if (str2Copy == NULL)
            goto err_memory;
    }
    if (str3 != NULL) {
        str3Copy = (char *) xmlStrdup((const xmlChar *) str3);
        if (str3Copy == NULL)
            goto err_memory;
    }

    xmlResetError(err);

    err->domain = domain;
    err->code = code;
    err->message = message;
    err->level = level;
    err->file = fileCopy;
    err->line = line;
    err->str1 = str1Copy;
    err->str2 = str2Copy;
    err->str3 = str3Copy;
    err->int1 = int1;
    err->int2 = col;
    err->node = node;
    err->ctxt = ctxt;

    return(0);

err_memory:
    xmlFree(message);
    xmlFree(fileCopy);
    xmlFree(str1Copy);
    xmlFree(str2Copy);
    xmlFree(str3Copy);
    return(-1);
}